

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_PushBack_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
TestBody(ParticleArrayTest_PushBack_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
         *this)

{
  Particle<(pica::Dimension)1> particle;
  undefined1 uVar1;
  bool bVar2;
  AssertionResult gtest_ar_;
  ParticleArray particlesCopy;
  int i;
  ParticleArray particles;
  undefined8 in_stack_fffffffffffffdd8;
  undefined1 success;
  String *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  int line;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  Type type;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  String local_1d8;
  Message *in_stack_fffffffffffffe38;
  AssertHelper *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe50;
  AssertionResult *in_stack_fffffffffffffe58;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe70;
  ParticleArray *in_stack_fffffffffffffe78;
  ParticleArray *in_stack_fffffffffffffe80;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *in_stack_fffffffffffffe88;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe98 [16];
  undefined8 local_f0;
  String *pSStack_e8;
  char *pcStack_d8;
  undefined8 local_d0;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *pPStack_c8;
  undefined8 local_c0;
  int local_b4;
  
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::ParticleArraySoA
            ((ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> *)
             CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  local_b4 = 0;
  while( true ) {
    type = (Type)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    line = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    success = (undefined1)((ulong)in_stack_fffffffffffffdd8 >> 0x38);
    if (0x10 < local_b4) break;
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              ((BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)
               CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    particle.p.x = (double)in_stack_fffffffffffffe78;
    particle.position.x = (double)in_stack_fffffffffffffe70;
    particle.p.y = (double)in_stack_fffffffffffffe80;
    particle.p.z = (double)in_stack_fffffffffffffe88;
    particle.factor = (FactorType)in_stack_fffffffffffffe90;
    particle.invGamma = (GammaType)in_stack_fffffffffffffe98._0_8_;
    particle.typeIndex = in_stack_fffffffffffffe98._8_2_;
    particle._50_6_ = in_stack_fffffffffffffe98._10_6_;
    in_stack_fffffffffffffdd8 = local_f0;
    in_stack_fffffffffffffde0 = pSStack_e8;
    in_stack_fffffffffffffdf0 = pcStack_d8;
    in_stack_fffffffffffffdf8 = local_d0;
    in_stack_fffffffffffffe00 = pPStack_c8;
    in_stack_fffffffffffffe08 = local_c0;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>>::
    pushBack<pica::Particle<(pica::Dimension)1>>(in_stack_fffffffffffffe60,particle);
    local_b4 = local_b4 + 1;
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::ParticleArraySoA
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  uVar1 = ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
          eqParticleArrays((ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
                            *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                           in_stack_fffffffffffffe78);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffde0,(bool)success);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe48);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_fffffffffffffe10));
    testing::internal::GetBoolAssertionFailureMessage
              (in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50.ptr_,
               in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
    testing::internal::String::c_str(&local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffe10),type,
               (char *)in_stack_fffffffffffffe00,line,in_stack_fffffffffffffdf0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffde0);
    testing::internal::String::~String(in_stack_fffffffffffffde0);
    testing::Message::~Message((Message *)0x22314b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2231e3);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::~ParticleArraySoA
            (in_stack_fffffffffffffe00);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::~ParticleArraySoA
            (in_stack_fffffffffffffe00);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, PushBack)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    for (int i = 0; i < 17; i++)
        particles.pushBack(this->randomParticle());
    ParticleArray particlesCopy(particles);
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
}